

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  long lVar2;
  undefined4 in_register_0000003c;
  secp256k1_ge *r;
  secp256k1_fe *rzr;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  r = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  secp256k1_gej_double_var(&local_108,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
  local_88.infinity = 0;
  local_88.x.n[0] = local_108.x.n[0];
  local_88.x.n[1] = local_108.x.n[1];
  local_88.x.n[2] = local_108.x.n[2];
  local_88.x.n[3] = local_108.x.n[3];
  local_88.x.n[4] = local_108.x.n[4];
  local_88.y.n[0] = local_108.y.n[0];
  local_88.y.n[1] = local_108.y.n[1];
  local_88.y.n[2] = local_108.y.n[2];
  local_88.y.n[3] = local_108.y.n[3];
  local_88.y.n[4] = local_108.y.n[4];
  secp256k1_ge_set_gej_zinv(r,(secp256k1_gej *)z,&local_108.z);
  local_188.infinity = r->infinity;
  local_188.x.n[4] = (r->x).n[4];
  local_188.x.n[0] = (r->x).n[0];
  local_188.x.n[1] = (r->x).n[1];
  local_188.x.n[2] = (r->x).n[2];
  local_188.x.n[3] = (r->x).n[3];
  local_188.y.n[0] = (r->y).n[0];
  local_188.y.n[1] = (r->y).n[1];
  local_188.y.n[2] = (r->y).n[2];
  local_188.y.n[3] = (r->y).n[3];
  local_188.y.n[4] = (r->y).n[4];
  local_188.z.n[0] = z[2].n[0];
  local_188.z.n[1] = z[2].n[1];
  local_188.z.n[2] = z[2].n[2];
  local_188.z.n[3] = z[2].n[3];
  local_188.z.n[4] = z[2].n[4];
  (pre_a->x).n[4] = local_108.z.n[4];
  (pre_a->x).n[2] = local_108.z.n[2];
  (pre_a->x).n[3] = local_108.z.n[3];
  (pre_a->x).n[0] = local_108.z.n[0];
  (pre_a->x).n[1] = local_108.z.n[1];
  rzr = &pre_a->y;
  for (lVar2 = 0xa8; lVar2 != 0x310; lVar2 = lVar2 + 0x58) {
    secp256k1_gej_add_ge_var(&local_188,&local_188,&local_88,rzr);
    *(undefined4 *)((long)(r->x).n + lVar2) = 0;
    puVar1 = (uint64_t *)((long)(&r->x + -2) + lVar2);
    *puVar1 = local_188.x.n[0];
    puVar1[1] = local_188.x.n[1];
    puVar1 = (uint64_t *)((long)(r->x).n + lVar2 + -0x40);
    *puVar1 = local_188.x.n[2];
    puVar1[1] = local_188.x.n[3];
    *(uint64_t *)((long)(r->x).n + lVar2 + -0x30) = local_188.x.n[4];
    puVar1 = (uint64_t *)((long)(&r->x + -1) + lVar2);
    *puVar1 = local_188.y.n[0];
    puVar1[1] = local_188.y.n[1];
    puVar1 = (uint64_t *)((long)(r->x).n + lVar2 + -0x18);
    *puVar1 = local_188.y.n[2];
    puVar1[1] = local_188.y.n[3];
    *(uint64_t *)((long)(r->x).n + lVar2 + -8) = local_188.y.n[4];
    rzr = rzr + 1;
  }
  secp256k1_fe_mul(zr,&local_188.z,&local_108.z);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equvalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}